

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

void duckdb::Timestamp::Convert
               (timestamp_ns_t input,date_t *out_date,dtime_t *out_time,int32_t *out_nanos)

{
  bool bVar1;
  date_t dVar2;
  ConversionException *this;
  allocator local_59;
  int64_t days_nanos;
  string local_50;
  
  dVar2 = GetDate((timestamp_t)
                  (((long)input.super_timestamp_t.value -
                   ((long)input.super_timestamp_t.value >> 0x3f)) / 1000 +
                  ((long)input.super_timestamp_t.value >> 0x3f)));
  out_date->days = (int32_t)dVar2;
  bVar1 = TryMultiplyOperator::Operation<long,long,long>
                    ((long)dVar2.days,86400000000000,&days_nanos);
  if (bVar1) {
    out_time->micros = ((long)input.super_timestamp_t.value - days_nanos) / 1000;
    *out_nanos = (int32_t)(((long)input.super_timestamp_t.value - days_nanos) % 1000);
    return;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Date out of range in timestamp_ns conversion",&local_59);
  ConversionException::ConversionException(this,&local_50);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Timestamp::Convert(timestamp_ns_t input, date_t &out_date, dtime_t &out_time, int32_t &out_nanos) {
	timestamp_t ms(TemporalRound(input.value, Interval::NANOS_PER_MICRO));
	out_date = Timestamp::GetDate(ms);
	int64_t days_nanos;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(out_date.days, Interval::NANOS_PER_DAY,
	                                                               days_nanos)) {
		throw ConversionException("Date out of range in timestamp_ns conversion");
	}

	out_time = dtime_t((input.value - days_nanos) / Interval::NANOS_PER_MICRO);
	out_nanos = UnsafeNumericCast<int32_t>((input.value - days_nanos) % Interval::NANOS_PER_MICRO);
}